

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nds2sf.cpp
# Opt level: O3

bool NDS2SF::make_mini2sf
               (string *nds2sf_path,uint32_t address,size_t size,uint32_t num,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *tags)

{
  bool bVar1;
  uint8_t local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  
  bVar1 = false;
  memset(&local_138,0,0x108);
  if (size < 0x101) {
    local_138 = (uint8_t)address;
    local_137 = (undefined1)(address >> 8);
    local_136 = (undefined1)(address >> 0x10);
    local_135 = (undefined1)(address >> 0x18);
    local_134 = (undefined1)size;
    local_133 = (undefined1)(size >> 8);
    local_131 = 0;
    local_130 = (undefined1)num;
    local_12f = (undefined1)(num >> 8);
    local_12e = (undefined1)(num >> 0x10);
    local_12d = (undefined1)(num >> 0x18);
    bVar1 = exe2sf(nds2sf_path,&local_138,size + 8,tags);
  }
  return bVar1;
}

Assistant:

bool NDS2SF::make_mini2sf(const std::string& nds2sf_path, uint32_t address, size_t size, uint32_t num, std::map<std::string, std::string>& tags)
{
	uint8_t exe[NDS2SF_EXE_HEADER_SIZE + 256];
	memset(exe, 0, NDS2SF_EXE_HEADER_SIZE + 256);

	// limit size
	if (size > 256)
	{
		return false;
	}

	// make exe
	put_2sf_exe_header(exe, address, (uint32_t)size);
	mput4l(num, &exe[NDS2SF_EXE_HEADER_SIZE]);

	// write mini2sf file
	return exe2sf(nds2sf_path, exe, NDS2SF_EXE_HEADER_SIZE + size, tags);
}